

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

faidx_t * fai_read(FILE *fp)

{
  int iVar1;
  faidx_t *idx;
  kh_s_t *pkVar2;
  char *__s;
  char *pcVar3;
  ushort **ppuVar4;
  char cVar5;
  int line_blen;
  int line_len;
  int len;
  longlong offset;
  int local_44;
  int local_40;
  int local_3c;
  uint64_t local_38;
  
  idx = (faidx_t *)calloc(1,0x20);
  pkVar2 = (kh_s_t *)calloc(1,0x28);
  idx->hash = pkVar2;
  __s = (char *)calloc(0x10000,1);
  iVar1 = feof((FILE *)fp);
  if (iVar1 == 0) {
    do {
      pcVar3 = fgets(__s,0x10000,(FILE *)fp);
      if (pcVar3 == (char *)0x0) break;
      cVar5 = *__s;
      pcVar3 = __s;
      if (cVar5 != '\0') {
        ppuVar4 = __ctype_b_loc();
        do {
          if (-1 < (short)(*ppuVar4)[cVar5]) break;
          cVar5 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
        } while (cVar5 != '\0');
      }
      *pcVar3 = '\0';
      __isoc99_sscanf(pcVar3 + 1,"%d%lld%d%d",&local_3c,&local_38,&local_44,&local_40);
      fai_insert_index(idx,__s,local_3c,local_40,local_44,local_38);
      iVar1 = feof((FILE *)fp);
    } while (iVar1 == 0);
  }
  free(__s);
  return idx;
}

Assistant:

faidx_t *fai_read(FILE *fp)
{
    faidx_t *fai;
    char *buf, *p;
    int len, line_len, line_blen;
#ifdef _WIN32
    long offset;
#else
    long long offset;
#endif
    fai = (faidx_t*)calloc(1, sizeof(faidx_t));
    fai->hash = kh_init(s);
    buf = (char*)calloc(0x10000, 1);
    while (!feof(fp) && fgets(buf, 0x10000, fp)) {
        for (p = buf; *p && isgraph(*p); ++p);
        *p = 0; ++p;
#ifdef _WIN32
        sscanf(p, "%d%ld%d%d", &len, &offset, &line_blen, &line_len);
#else
        sscanf(p, "%d%lld%d%d", &len, &offset, &line_blen, &line_len);
#endif
        fai_insert_index(fai, buf, len, line_len, line_blen, offset);
    }
    free(buf);
    return fai;
}